

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btWheelInfo.cpp
# Opt level: O0

void __thiscall
btWheelInfo::updateWheel(btWheelInfo *this,btRigidBody *chassis,RaycastInfo *raycastInfo)

{
  btWheelInfo *in_RDI;
  btScalar bVar1;
  btVector3 bVar2;
  btScalar inv;
  btScalar projVel;
  btVector3 relpos;
  btVector3 chassis_velocity_at_contactPoint;
  btScalar project;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  btScalar local_4c [2];
  btScalar local_44 [6];
  btVector3 local_2c;
  btScalar local_1c;
  
  if (((in_RDI->m_raycastInfo).m_isInContact & 1U) == 0) {
    bVar1 = getSuspensionRestLength(in_RDI);
    (in_RDI->m_raycastInfo).m_suspensionLength = bVar1;
    in_RDI->m_suspensionRelativeVelocity = 0.0;
    bVar2 = operator-((btVector3 *)in_RDI);
    *(long *)(in_RDI->m_raycastInfo).m_contactNormalWS.m_floats = bVar2.m_floats._0_8_;
    *(long *)((in_RDI->m_raycastInfo).m_contactNormalWS.m_floats + 2) = bVar2.m_floats._8_8_;
    in_RDI->m_clippedInvContactDotSuspension = 1.0;
  }
  else {
    local_1c = btVector3::dot((btVector3 *)in_RDI,&(in_RDI->m_raycastInfo).m_wheelDirectionWS);
    btVector3::btVector3(&local_2c);
    btRigidBody::getCenterOfMassPosition((btRigidBody *)0x2370ef);
    operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
              (btVector3 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    bVar2 = btRigidBody::getVelocityInLocalPoint
                      ((btRigidBody *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (btVector3 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    local_4c = bVar2.m_floats._0_8_;
    local_2c.m_floats[0] = local_4c[0];
    local_2c.m_floats[1] = local_4c[1];
    local_44._0_8_ = bVar2.m_floats._8_8_;
    local_2c.m_floats[2] = local_44[0];
    local_2c.m_floats[3] = local_44[1];
    bVar1 = btVector3::dot((btVector3 *)in_RDI,&local_2c);
    if (local_1c < -0.1) {
      in_RDI->m_suspensionRelativeVelocity = bVar1 * (-1.0 / local_1c);
      in_RDI->m_clippedInvContactDotSuspension = -1.0 / local_1c;
    }
    else {
      in_RDI->m_suspensionRelativeVelocity = 0.0;
      in_RDI->m_clippedInvContactDotSuspension = 10.0;
    }
  }
  return;
}

Assistant:

void	btWheelInfo::updateWheel(const btRigidBody& chassis,RaycastInfo& raycastInfo)
{
	(void)raycastInfo;

	
	if (m_raycastInfo.m_isInContact)

	{
		btScalar	project= m_raycastInfo.m_contactNormalWS.dot( m_raycastInfo.m_wheelDirectionWS );
		btVector3	 chassis_velocity_at_contactPoint;
		btVector3 relpos = m_raycastInfo.m_contactPointWS - chassis.getCenterOfMassPosition();
		chassis_velocity_at_contactPoint = chassis.getVelocityInLocalPoint( relpos );
		btScalar projVel = m_raycastInfo.m_contactNormalWS.dot( chassis_velocity_at_contactPoint );
		if ( project >= btScalar(-0.1))
		{
			m_suspensionRelativeVelocity = btScalar(0.0);
			m_clippedInvContactDotSuspension = btScalar(1.0) / btScalar(0.1);
		}
		else
		{
			btScalar inv = btScalar(-1.) / project;
			m_suspensionRelativeVelocity = projVel * inv;
			m_clippedInvContactDotSuspension = inv;
		}
		
	}

	else	// Not in contact : position wheel in a nice (rest length) position
	{
		m_raycastInfo.m_suspensionLength = this->getSuspensionRestLength();
		m_suspensionRelativeVelocity = btScalar(0.0);
		m_raycastInfo.m_contactNormalWS = -m_raycastInfo.m_wheelDirectionWS;
		m_clippedInvContactDotSuspension = btScalar(1.0);
	}
}